

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMergingMethods
          (MessageGenerator *this,Printer *printer)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Type TVar5;
  WireType WVar6;
  mapped_type *pmVar7;
  FieldDescriptor *this_00;
  OneofDescriptor *pOVar8;
  pointer pFVar9;
  ulong uVar10;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar11;
  size_type sVar12;
  const_reference ppFVar13;
  MessageGenerator *in_RSI;
  MessageGenerator *in_RDI;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  generator_2;
  uint32 tag;
  WireType wt;
  FieldDescriptor *field_1;
  int i_2;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  generator_1;
  FieldDescriptor *field;
  int j;
  int i_1;
  unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
  generator;
  int i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  undefined4 in_stack_fffffffffffffc18;
  uint in_stack_fffffffffffffc1c;
  AlphaNum *in_stack_fffffffffffffc20;
  FieldGeneratorBase *in_stack_fffffffffffffc28;
  MessageGenerator *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffc60;
  MessageGenerator *in_stack_fffffffffffffc68;
  Printer *in_stack_fffffffffffffc70;
  FieldGeneratorBase *in_stack_fffffffffffffc78;
  Printer *in_stack_fffffffffffffc80;
  AlphaNum local_2a0;
  string local_268 [80];
  string local_218 [24];
  char *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  WireType type;
  Printer *in_stack_fffffffffffffe10;
  value_type this_01;
  int local_1e4;
  string local_1b0 [32];
  undefined1 local_190 [16];
  string local_180 [32];
  undefined1 local_160 [48];
  string local_130 [32];
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [36];
  int local_a4;
  int local_98;
  allocator local_91;
  string local_90 [48];
  string local_60 [80];
  MessageGenerator *local_10;
  
  local_10 = in_RSI;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x52d604);
  class_name_abi_cxx11_((MessageGenerator *)in_stack_fffffffffffffc28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"class_name",&local_91);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](in_stack_fffffffffffffc60,
                        (key_type *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  std::__cxx11::string::operator=((string *)pmVar7,local_60);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_60);
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            ((SourceGeneratorBase *)in_stack_fffffffffffffc20,
             (Printer *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  io::Printer::Print(in_stack_fffffffffffffe10,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                     in_stack_fffffffffffffe00);
  io::Printer::Indent((Printer *)0x52d6f3);
  io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  for (local_98 = 0; iVar4 = local_98, iVar3 = Descriptor::field_count(in_RDI->descriptor_),
      iVar4 < iVar3; local_98 = local_98 + 1) {
    this_00 = Descriptor::field(in_RDI->descriptor_,local_98);
    pOVar8 = FieldDescriptor::containing_oneof(this_00);
    if (pOVar8 == (OneofDescriptor *)0x0) {
      Descriptor::field(in_RDI->descriptor_,local_98);
      CreateFieldGeneratorInternal
                (in_stack_fffffffffffffc30,(FieldDescriptor *)in_stack_fffffffffffffc28);
      std::
      unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
      ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
                ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                  *)in_stack_fffffffffffffc20,
                 (pointer)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      pFVar9 = std::
               unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
               ::operator->((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                             *)0x52d80a);
      (*(pFVar9->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar9,local_10);
      std::
      unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
      ::~unique_ptr((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                     *)in_stack_fffffffffffffc20);
    }
  }
  for (local_a4 = 0; iVar4 = local_a4, iVar3 = Descriptor::oneof_decl_count(in_RDI->descriptor_),
      iVar4 < iVar3; local_a4 = local_a4 + 1) {
    pOVar8 = Descriptor::oneof_decl(in_RDI->descriptor_,local_a4);
    OneofDescriptor::name_abi_cxx11_(pOVar8);
    UnderscoresToCamelCase
              ((string *)in_stack_fffffffffffffc28,SUB81((ulong)in_stack_fffffffffffffc20 >> 0x38,0)
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"name",&local_e9);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffffc60,
                          (key_type *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58))
    ;
    std::__cxx11::string::operator=((string *)pmVar7,local_c8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::__cxx11::string::~string(local_c8);
    pOVar8 = Descriptor::oneof_decl(in_RDI->descriptor_,local_a4);
    OneofDescriptor::name_abi_cxx11_(pOVar8);
    UnderscoresToCamelCase
              ((string *)in_stack_fffffffffffffc28,SUB81((ulong)in_stack_fffffffffffffc20 >> 0x38,0)
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"property_name",(allocator *)(local_160 + 0x2f));
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_fffffffffffffc60,
                          (key_type *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58))
    ;
    std::__cxx11::string::operator=((string *)pmVar7,local_110);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)(local_160 + 0x2f));
    std::__cxx11::string::~string(local_110);
    io::Printer::Print(in_stack_fffffffffffffe10,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       in_stack_fffffffffffffe00);
    io::Printer::Indent((Printer *)0x52db26);
    local_160._40_4_ = _S_red;
    while( true ) {
      uVar1 = local_160._40_4_;
      pOVar8 = Descriptor::oneof_decl(in_RDI->descriptor_,local_a4);
      iVar4 = OneofDescriptor::field_count(pOVar8);
      if (iVar4 <= (int)uVar1) break;
      pOVar8 = Descriptor::oneof_decl(in_RDI->descriptor_,local_a4);
      local_160._32_8_ = OneofDescriptor::field(pOVar8,local_160._40_4_);
      GetPropertyName_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffffc78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"field_property_name",(allocator *)(local_190 + 0xf));
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_fffffffffffffc60,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      in_stack_fffffffffffffc80 = (Printer *)local_160;
      std::__cxx11::string::operator=((string *)pmVar7,(string *)in_stack_fffffffffffffc80);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator((allocator<char> *)(local_190 + 0xf));
      std::__cxx11::string::~string((string *)in_stack_fffffffffffffc80);
      io::Printer::Print(in_stack_fffffffffffffe10,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                         in_stack_fffffffffffffe00);
      io::Printer::Indent((Printer *)0x52dca5);
      in_stack_fffffffffffffc78 =
           CreateFieldGeneratorInternal
                     (in_stack_fffffffffffffc30,(FieldDescriptor *)in_stack_fffffffffffffc28);
      in_stack_fffffffffffffc70 = (Printer *)local_190;
      std::
      unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
      ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
                ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                  *)in_stack_fffffffffffffc20,
                 (pointer)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
      pFVar9 = std::
               unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
               ::operator->((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                             *)0x52dce4);
      (*(pFVar9->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[7])(pFVar9,local_10);
      io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
      io::Printer::Outdent(in_stack_fffffffffffffc80);
      std::
      unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
      ::~unique_ptr((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                     *)in_stack_fffffffffffffc20);
      local_160._40_4_ = local_160._40_4_ + _S_black;
    }
    io::Printer::Outdent(in_stack_fffffffffffffc80);
    io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  }
  if ((in_RDI->has_extension_ranges_ & 1U) != 0) {
    io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  }
  io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  io::Printer::Outdent(in_stack_fffffffffffffc80);
  io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  SourceGeneratorBase::WriteGeneratedCodeAttributes
            ((SourceGeneratorBase *)in_stack_fffffffffffffc20,
             (Printer *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  io::Printer::Indent((Printer *)0x52df42);
  io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  io::Printer::Indent((Printer *)0x52df67);
  io::Printer::Indent((Printer *)0x52df76);
  if (in_RDI->end_tag_ != 0) {
    in_stack_fffffffffffffc68 = local_10;
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
    StrCat_abi_cxx11_((AlphaNum *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    io::Printer::Print<char[8],std::__cxx11::string>
              (in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
               &in_stack_fffffffffffffc70->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc68);
    std::__cxx11::string::~string(local_1b0);
  }
  if ((in_RDI->has_extension_ranges_ & 1U) == 0) {
    io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  }
  else {
    io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  }
  local_1e4 = 0;
  while( true ) {
    uVar10 = (ulong)local_1e4;
    pvVar11 = fields_by_number(in_RDI);
    sVar12 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::size(pvVar11);
    if (sVar12 <= uVar10) break;
    pvVar11 = fields_by_number(in_RDI);
    ppFVar13 = std::
               vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::operator[](pvVar11,(long)local_1e4);
    this_01 = *ppFVar13;
    TVar5 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffc30);
    WVar6 = internal::WireFormat::WireTypeForFieldType(0);
    type = WVar6;
    iVar4 = FieldDescriptor::number(this_01);
    internal::WireFormatLite::MakeTag(iVar4,type);
    bVar2 = FieldDescriptor::is_packable((FieldDescriptor *)in_stack_fffffffffffffc20);
    if (bVar2) {
      iVar4 = FieldDescriptor::number(this_01);
      internal::WireFormatLite::MakeTag(iVar4,WIRETYPE_LENGTH_DELIMITED);
      strings::AlphaNum::AlphaNum(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
      StrCat_abi_cxx11_((AlphaNum *)CONCAT44(TVar5,WVar6));
      io::Printer::Print<char[11],std::__cxx11::string>
                (in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
                 &in_stack_fffffffffffffc70->variable_delimiter_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc68);
      std::__cxx11::string::~string(local_218);
    }
    in_stack_fffffffffffffc30 = local_10;
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
    StrCat_abi_cxx11_((AlphaNum *)CONCAT44(TVar5,WVar6));
    io::Printer::Print<char[4],std::__cxx11::string>
              (in_stack_fffffffffffffc80,(char *)in_stack_fffffffffffffc78,
               &in_stack_fffffffffffffc70->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc68);
    std::__cxx11::string::~string(local_268);
    io::Printer::Indent((Printer *)0x52e26f);
    in_stack_fffffffffffffc28 =
         CreateFieldGeneratorInternal
                   (in_stack_fffffffffffffc30,(FieldDescriptor *)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc20 = &local_2a0;
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>>
    ::unique_ptr<std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>,void>
              ((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                *)in_stack_fffffffffffffc20,
               (pointer)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    pFVar9 = std::
             unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
             ::operator->((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                           *)0x52e2ae);
    (*(pFVar9->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[8])(pFVar9,local_10);
    io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    io::Printer::Outdent(in_stack_fffffffffffffc80);
    io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
    std::
    unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
    ::~unique_ptr((unique_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::csharp::FieldGeneratorBase>_>
                   *)in_stack_fffffffffffffc20);
    local_1e4 = local_1e4 + 1;
  }
  io::Printer::Outdent(in_stack_fffffffffffffc80);
  io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  io::Printer::Outdent(in_stack_fffffffffffffc80);
  io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  io::Printer::Outdent(in_stack_fffffffffffffc80);
  io::Printer::Print<>(in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x52e3ea);
  return;
}

Assistant:

void MessageGenerator::GenerateMergingMethods(io::Printer* printer) {
  // Note:  These are separate from GenerateMessageSerializationMethods()
  //   because they need to be generated even for messages that are optimized
  //   for code size.
  std::map<string, string> vars;
  vars["class_name"] = class_name();

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public void MergeFrom($class_name$ other) {\n");
  printer->Indent();
  printer->Print(
    "if (other == null) {\n"
    "  return;\n"
    "}\n");
  // Merge non-oneof fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->containing_oneof()) {
      std::unique_ptr<FieldGeneratorBase> generator(
          CreateFieldGeneratorInternal(descriptor_->field(i)));
      generator->GenerateMergingCode(printer);
    }
  }
  // Merge oneof fields
  for (int i = 0; i < descriptor_->oneof_decl_count(); ++i) {
    vars["name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true);
    printer->Print(vars, "switch (other.$property_name$Case) {\n");
    printer->Indent();
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      vars["field_property_name"] = GetPropertyName(field);
      printer->Print(
        vars,
        "case $property_name$OneofCase.$field_property_name$:\n");
      printer->Indent();
      std::unique_ptr<FieldGeneratorBase> generator(CreateFieldGeneratorInternal(field));
      generator->GenerateMergingCode(printer);
      printer->Print("break;\n");
      printer->Outdent();
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
  // Merge extensions
  if (has_extension_ranges_) {
    printer->Print("pb::ExtensionSet.MergeFrom(ref _extensions, other._extensions);\n");
  }

  // Merge unknown fields.
  printer->Print(
      "_unknownFields = pb::UnknownFieldSet.MergeFrom(_unknownFields, other._unknownFields);\n");

  printer->Outdent();
  printer->Print("}\n\n");


  WriteGeneratedCodeAttributes(printer);
  printer->Print("public void MergeFrom(pb::CodedInputStream input) {\n");
  printer->Indent();
  printer->Print(
    "uint tag;\n"
    "while ((tag = input.ReadTag()) != 0) {\n"
    "  switch(tag) {\n");
  printer->Indent();
  printer->Indent();
  if (end_tag_ != 0) {
    printer->Print(
      "$end_tag$:\n"
      "  return;\n",
      "end_tag", StrCat(end_tag_));
  }
  if (has_extension_ranges_) {
    printer->Print(
      "default:\n"
      "  if (!pb::ExtensionSet.TryMergeFieldFrom(ref _extensions, input)) {\n"
      "    _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, input);\n"
      "  }\n"
      "  break;\n");
  } else {
    printer->Print(
      "default:\n"
      "  _unknownFields = pb::UnknownFieldSet.MergeFieldFrom(_unknownFields, input);\n"
      "  break;\n");
  }
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    internal::WireFormatLite::WireType wt =
        internal::WireFormat::WireTypeForFieldType(field->type());
    uint32 tag = internal::WireFormatLite::MakeTag(field->number(), wt);
    // Handle both packed and unpacked repeated fields with the same Read*Array call;
    // the two generated cases are the packed and unpacked tags.
    // TODO(jonskeet): Check that is_packable is equivalent to
    // is_repeated && wt in { VARINT, FIXED32, FIXED64 }.
    // It looks like it is...
    if (field->is_packable()) {
      printer->Print(
        "case $packed_tag$:\n",
        "packed_tag",
        StrCat(
            internal::WireFormatLite::MakeTag(
                field->number(),
                internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED)));
    }

    printer->Print("case $tag$: {\n", "tag", StrCat(tag));
    printer->Indent();
    std::unique_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(field));
    generator->GenerateParsingCode(printer);
    printer->Print("break;\n");
    printer->Outdent();
    printer->Print("}\n");
  }
  printer->Outdent();
  printer->Print("}\n"); // switch
  printer->Outdent();
  printer->Print("}\n"); // while
  printer->Outdent();
  printer->Print("}\n\n"); // method
}